

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O1

char * Corrade::Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
                 (Array<char,_void_(*)(char_*,_unsigned_long)> *array,type_conflict2 *value)

{
  char *pcVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  Error local_30;
  
  if (array->_deleter == ArrayMallocAllocator<char>::deleter) {
    uVar2 = *(long *)(array->_data + -8) - 8;
  }
  else {
    uVar2 = array->_size;
  }
  if (uVar2 <= (ulong)((long)value - (long)array->_data)) {
    pcVar1 = Implementation::arrayGrowBy<char,Corrade::Containers::ArrayMallocAllocator<char>>
                       (array,1);
    *pcVar1 = *value;
    return pcVar1;
  }
  local_30.super_Debug._previousGlobalOutput = *(ostream **)(in_FS_OFFSET + -0x20);
  local_30.super_Debug._flags._value = '\0';
  local_30.super_Debug._immediateFlags._value = '\x04';
  local_30.super_Debug._internalFlags._value = 0;
  local_30.super_Debug._sourceLocationLine = 0;
  local_30.super_Debug._sourceLocationFile = (char *)0x0;
  local_30.super_Debug._previousColor = *(Color *)(in_FS_OFFSET + -8);
  if (*(char *)(in_FS_OFFSET + -7) == '\x01') {
    local_30.super_Debug._internalFlags._value = 8;
  }
  if (*(char *)(in_FS_OFFSET + -6) == '\x01') {
    local_30.super_Debug._internalFlags._value = local_30.super_Debug._internalFlags._value | 0x10;
  }
  local_30._previousGlobalErrorOutput = *(ostream **)(in_FS_OFFSET + -0x10);
  local_30.super_Debug._output = (ostream *)&std::cerr;
  *(undefined8 **)(in_FS_OFFSET + -0x10) = &std::cerr;
  Utility::Debug::operator<<
            (&local_30.super_Debug,
             "Containers::arrayAppend(): use the list variant to append values from within the array itself"
            );
  Utility::Error::~Error(&local_30);
  abort();
}

Assistant:

inline T& arrayAppend(Array<T>& array, typename std::common_type<T>::type&& value) {
    CORRADE_DEBUG_ASSERT(std::size_t(&value - array.data()) >= (arrayCapacity<T, Allocator>(array)),
        "Containers::arrayAppend(): use the list variant to append values from within the array itself", *array.data());
    return arrayAppend<T, Allocator>(array, Corrade::InPlaceInit, Utility::move(value));
}